

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O0

int pcap_compile(pcap_t *p,bpf_program *program,char *buf,int optimize,bpf_u_int32 mask)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  bpf_insn *pbVar4;
  char *local_320;
  int local_318;
  u_int local_314;
  int rc;
  u_int len;
  YY_BUFFER_STATE in_buffer;
  yyscan_t scanner;
  char *xbuf;
  compiler_state_t cstate;
  bpf_u_int32 mask_local;
  int optimize_local;
  char *buf_local;
  bpf_program *program_local;
  pcap_t *p_local;
  
  in_buffer = (YY_BUFFER_STATE)0x0;
  _rc = (YY_BUFFER_STATE)0x0;
  scanner = buf;
  cstate.cur_chunk = mask;
  cstate._716_4_ = optimize;
  if (p->activated == 0) {
    snprintf(p->errbuf,0x100,"not-yet-activated pcap_t passed to pcap_compile");
    local_318 = -1;
  }
  else {
    initchunks((compiler_state_t *)&xbuf);
    cstate.outermostlinktype = 0;
    cstate.pcap_fddipad = 0;
    cstate._260_4_ = 0;
    cstate.bpf_pcap = (pcap_t *)0x0;
    cstate.ic.root._0_4_ = 0;
    cstate.top_ctx[0].__saved_mask.__val[0xf] = (unsigned_long)p;
    init_regs((compiler_state_t *)&xbuf);
    iVar1 = _setjmp((__jmp_buf_tag *)&xbuf);
    if (iVar1 == 0) {
      cstate.prevlinktype = cstate.cur_chunk;
      cstate.ic.cur_mark = pcap_snapshot(p);
      if (cstate.ic.cur_mark == 0) {
        snprintf(p->errbuf,0x100,"snaplen of 0 rejects all packets");
        local_318 = -1;
      }
      else {
        iVar1 = pcap_lex_init(&in_buffer);
        if (iVar1 != 0) {
          piVar2 = __errno_location();
          pcVar3 = pcap_strerror(*piVar2);
          bpf_error((compiler_state_t *)&xbuf,"can\'t initialize scanner: %s",pcVar3);
        }
        if (scanner == (yyscan_t)0x0) {
          local_320 = "";
        }
        else {
          local_320 = (char *)scanner;
        }
        _rc = pcap__scan_string(local_320,in_buffer);
        pcap_set_extra((compiler_state_t *)&xbuf,in_buffer);
        init_linktype((compiler_state_t *)&xbuf,p);
        pcap_parse(in_buffer,(compiler_state_t *)&xbuf);
        if (cstate.bpf_pcap == (pcap_t *)0x0) {
          cstate.bpf_pcap = (pcap_t *)gen_retblk((compiler_state_t *)&xbuf,cstate.ic.cur_mark);
        }
        if (((cstate._716_4_ != 0) && (cstate.outermostlinktype == 0)) &&
           ((bpf_optimize((compiler_state_t *)&xbuf,(icode *)&cstate.bpf_pcap),
            cstate.bpf_pcap == (pcap_t *)0x0 ||
            (((cstate.bpf_pcap)->fd == 6 && (*(int *)&(cstate.bpf_pcap)->bp == 0)))))) {
          bpf_error((compiler_state_t *)&xbuf,"expression rejects all packets");
        }
        pbVar4 = icode_to_fcode((compiler_state_t *)&xbuf,(icode *)&cstate.bpf_pcap,
                                (block *)cstate.bpf_pcap,&local_314);
        program->bf_insns = pbVar4;
        program->bf_len = local_314;
        local_318 = 0;
      }
    }
    else {
      if (cstate._256_8_ != 0) {
        freeaddrinfo((addrinfo *)cstate._256_8_);
      }
      local_318 = -1;
    }
  }
  if (_rc != (YY_BUFFER_STATE)0x0) {
    pcap__delete_buffer(_rc,in_buffer);
  }
  if (in_buffer != (YY_BUFFER_STATE)0x0) {
    pcap_lex_destroy(in_buffer);
  }
  freechunks((compiler_state_t *)&xbuf);
  return local_318;
}

Assistant:

int
pcap_compile(pcap_t *p, struct bpf_program *program,
	     const char *buf, int optimize, bpf_u_int32 mask)
{
	compiler_state_t cstate;
	const char * volatile xbuf = buf;
	yyscan_t scanner = NULL;
	YY_BUFFER_STATE in_buffer = NULL;
	u_int len;
	int  rc;

#ifdef _WIN32
	static int done = 0;

	if (!done)
		pcap_wsockinit();
	done = 1;
#endif

	/*
	 * If this pcap_t hasn't been activated, it doesn't have a
	 * link-layer type, so we can't use it.
	 */
	if (!p->activated) {
		pcap_snprintf(p->errbuf, PCAP_ERRBUF_SIZE,
		    "not-yet-activated pcap_t passed to pcap_compile");
		rc = -1;
		goto quit;
	}
	initchunks(&cstate);
	cstate.no_optimize = 0;
	cstate.ai = NULL;
	cstate.ic.root = NULL;
	cstate.ic.cur_mark = 0;
	cstate.bpf_pcap = p;
	init_regs(&cstate);

	if (setjmp(cstate.top_ctx)) {
#ifdef INET6
		if (cstate.ai != NULL)
			freeaddrinfo(cstate.ai);
#endif
		rc = -1;
		goto quit;
	}

	cstate.netmask = mask;

	cstate.snaplen = pcap_snapshot(p);
	if (cstate.snaplen == 0) {
		pcap_snprintf(p->errbuf, PCAP_ERRBUF_SIZE,
			 "snaplen of 0 rejects all packets");
		rc = -1;
		goto quit;
	}

	if (pcap_lex_init(&scanner) != 0)
		bpf_error(&cstate, "can't initialize scanner: %s", pcap_strerror(errno));
	in_buffer = pcap__scan_string(xbuf ? xbuf : "", scanner);

	/*
	 * Associate the compiler state with the lexical analyzer
	 * state.
	 */
	pcap_set_extra(&cstate, scanner);

	init_linktype(&cstate, p);
	(void)pcap_parse(scanner, &cstate);

	if (cstate.ic.root == NULL)
		cstate.ic.root = gen_retblk(&cstate, cstate.snaplen);

	if (optimize && !cstate.no_optimize) {
		bpf_optimize(&cstate, &cstate.ic);
		if (cstate.ic.root == NULL ||
		    (cstate.ic.root->s.code == (BPF_RET|BPF_K) && cstate.ic.root->s.k == 0))
			bpf_error(&cstate, "expression rejects all packets");
	}
	program->bf_insns = icode_to_fcode(&cstate, &cstate.ic, cstate.ic.root, &len);
	program->bf_len = len;

	rc = 0;  /* We're all okay */

quit:
	/*
	 * Clean up everything for the lexical analyzer.
	 */
	if (in_buffer != NULL)
		pcap__delete_buffer(in_buffer, scanner);
	if (scanner != NULL)
		pcap_lex_destroy(scanner);

	/*
	 * Clean up our own allocated memory.
	 */
	freechunks(&cstate);

	return (rc);
}